

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picPageAnalyzer.cpp
# Opt level: O0

picPageAnalyzer * __thiscall picPageAnalyzer::getPrevPageURL_abi_cxx11_(picPageAnalyzer *this)

{
  string *in_RSI;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [40];
  picPageAnalyzer *this_local;
  
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"id=\"prev\"",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"href=\"",&local_71);
  pageAnalyzer::getInfoFromContent
            (&this->super_pageAnalyzer,in_RSI,(int)local_38,0,(string *)0x12,(char)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return this;
}

Assistant:

std::string picPageAnalyzer::getPrevPageURL()
{
    return this->getInfoFromContent(std::string("id=\"prev\""), 0, GETMODE_PART, std::string("href=\""), '\"');
}